

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_db_config(sqlite3 *db,int op,...)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int in_ECX;
  long lVar5;
  void *in_RDX;
  va_list ap;
  char *local_c8;
  uint *local_c0;
  int local_b8;
  
  if (op == 1000) {
    db->aDb->zDbSName = local_c8;
    return 0;
  }
  if (op == 0x3e9) {
    iVar3 = setupLookaside(db,in_RDX,in_ECX,local_b8);
    return iVar3;
  }
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (lVar5 == 5) {
      return 1;
    }
    lVar2 = lVar5 + 1;
  } while (sqlite3_db_config::aFlagOp[lVar5].op != op);
  local_c8._0_4_ = (int)in_RDX;
  uVar1 = db->flags;
  if ((int)local_c8 < 1) {
    if ((int)local_c8 != 0) goto LAB_00118129;
    uVar4 = ~*(uint *)(sqlite3_complete::trans[lVar5 + 8] + 4) & uVar1;
  }
  else {
    uVar4 = *(uint *)(sqlite3_complete::trans[lVar5 + 8] + 4) | uVar1;
  }
  db->flags = uVar4;
  if (uVar1 != uVar4) {
    sqlite3ExpirePreparedStatements(db);
  }
LAB_00118129:
  if (local_c0 != (uint *)0x0) {
    *local_c0 = (uint)((db->flags & *(uint *)(sqlite3_complete::trans[lVar5 + 8] + 4)) != 0);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_db_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc;
  va_start(ap, op);
  switch( op ){
    case SQLITE_DBCONFIG_MAINDBNAME: {
      db->aDb[0].zDbSName = va_arg(ap,char*);
      rc = SQLITE_OK;
      break;
    }
    case SQLITE_DBCONFIG_LOOKASIDE: {
      void *pBuf = va_arg(ap, void*); /* IMP: R-26835-10964 */
      int sz = va_arg(ap, int);       /* IMP: R-47871-25994 */
      int cnt = va_arg(ap, int);      /* IMP: R-04460-53386 */
      rc = setupLookaside(db, pBuf, sz, cnt);
      break;
    }
    default: {
      static const struct {
        int op;      /* The opcode */
        u32 mask;    /* Mask of the bit in sqlite3.flags to set/clear */
      } aFlagOp[] = {
        { SQLITE_DBCONFIG_ENABLE_FKEY,           SQLITE_ForeignKeys    },
        { SQLITE_DBCONFIG_ENABLE_TRIGGER,        SQLITE_EnableTrigger  },
        { SQLITE_DBCONFIG_ENABLE_FTS3_TOKENIZER, SQLITE_Fts3Tokenizer  },
        { SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION, SQLITE_LoadExtension  },
        { SQLITE_DBCONFIG_NO_CKPT_ON_CLOSE,      SQLITE_NoCkptOnClose  },
      };
      unsigned int i;
      rc = SQLITE_ERROR; /* IMP: R-42790-23372 */
      for(i=0; i<ArraySize(aFlagOp); i++){
        if( aFlagOp[i].op==op ){
          int onoff = va_arg(ap, int);
          int *pRes = va_arg(ap, int*);
          int oldFlags = db->flags;
          if( onoff>0 ){
            db->flags |= aFlagOp[i].mask;
          }else if( onoff==0 ){
            db->flags &= ~aFlagOp[i].mask;
          }
          if( oldFlags!=db->flags ){
            sqlite3ExpirePreparedStatements(db);
          }
          if( pRes ){
            *pRes = (db->flags & aFlagOp[i].mask)!=0;
          }
          rc = SQLITE_OK;
          break;
        }
      }
      break;
    }
  }
  va_end(ap);
  return rc;
}